

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<float,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
          (View<float,false,std::allocator<unsigned_long>> *this,unsigned_long *bit,
          unsigned_long *sit,View<float,_false,_std::allocator<unsigned_long>_> *out)

{
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  view<unsigned_long*,unsigned_long*>(this,bit,sit,(CoordinateOrder *)(this + 0x38),out);
  return;
}

Assistant:

inline void
View<T, isConst, A>::view
(
    BaseIterator bit,
    ShapeIterator sit,
    View<T, isConst, A>& out
) const
{
    view(bit, sit, coordinateOrder(), out);
}